

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Scene *pSVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  RTCIntersectArguments *pRVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  undefined4 uVar65;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1614;
  ulong local_1610;
  RTCIntersectArguments *local_1608;
  Geometry *local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong *local_15e0;
  RayQueryContext *local_15d8;
  long local_15d0;
  long local_15c8;
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  ulong local_1200;
  ulong local_11f8 [569];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar38 [16];
  undefined1 auVar66 [64];
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar76 = ray->tfar;
    if (0.0 <= fVar76) {
      aVar8 = (ray->dir).field_0;
      auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar36 = vandps_avx512vl((undefined1  [16])aVar8,auVar36);
      local_15e0 = local_11f8;
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      uVar30 = vcmpps_avx512vl(auVar36,auVar37,1);
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = 0x3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      auVar36 = vdivps_avx(auVar67,(undefined1  [16])aVar8);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar35 = (bool)((byte)uVar30 & 1);
      auVar38._0_4_ = (uint)bVar35 * auVar37._0_4_ | (uint)!bVar35 * auVar36._0_4_;
      bVar35 = (bool)((byte)(uVar30 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar35 * auVar37._4_4_ | (uint)!bVar35 * auVar36._4_4_;
      bVar35 = (bool)((byte)(uVar30 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar35 * auVar37._8_4_ | (uint)!bVar35 * auVar36._8_4_;
      bVar35 = (bool)((byte)(uVar30 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar35 * auVar37._12_4_ | (uint)!bVar35 * auVar36._12_4_;
      auVar39._8_4_ = 0x3f7ffffa;
      auVar39._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar39._12_4_ = 0x3f7ffffa;
      auVar39 = vmulps_avx512vl(auVar38,auVar39);
      auVar40._8_4_ = 0x3f800003;
      auVar40._0_8_ = 0x3f8000033f800003;
      auVar40._12_4_ = 0x3f800003;
      auVar40 = vmulps_avx512vl(auVar38,auVar40);
      auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar85 = ZEXT3264(auVar41);
      auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar86 = ZEXT3264(auVar41);
      auVar41 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar87 = ZEXT3264(auVar41);
      auVar41 = vbroadcastss_avx512vl(auVar39);
      auVar88 = ZEXT3264(auVar41);
      auVar36 = vmovshdup_avx(auVar39);
      auVar41 = vbroadcastsd_avx512vl(auVar36);
      auVar89 = ZEXT3264(auVar41);
      auVar37 = vshufpd_avx(auVar39,auVar39,1);
      auVar42._8_4_ = 2;
      auVar42._0_8_ = 0x200000002;
      auVar42._12_4_ = 2;
      auVar42._16_4_ = 2;
      auVar42._20_4_ = 2;
      auVar42._24_4_ = 2;
      auVar42._28_4_ = 2;
      auVar41 = vpermps_avx512vl(auVar42,ZEXT1632(auVar39));
      auVar90 = ZEXT3264(auVar41);
      fVar64 = auVar40._0_4_;
      auVar41._8_4_ = 1;
      auVar41._0_8_ = 0x100000001;
      auVar41._12_4_ = 1;
      auVar41._16_4_ = 1;
      auVar41._20_4_ = 1;
      auVar41._24_4_ = 1;
      auVar41._28_4_ = 1;
      auVar41 = vpermps_avx2(auVar41,ZEXT1632(auVar40));
      auVar69 = ZEXT3264(auVar41);
      auVar41 = vpermps_avx2(auVar42,ZEXT1632(auVar40));
      auVar75 = ZEXT3264(auVar41);
      local_15e8 = (ulong)(auVar39._0_4_ < 0.0) << 5;
      local_15f0 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
      uVar30 = (ulong)(auVar37._0_4_ < 0.0) << 5 | 0x80;
      uVar33 = local_15e8 ^ 0x20;
      uVar34 = local_15f0 ^ 0x20;
      uVar65 = auVar15._0_4_;
      auVar66 = ZEXT3264(CONCAT428(uVar65,CONCAT424(uVar65,CONCAT420(uVar65,CONCAT416(uVar65,
                                                  CONCAT412(uVar65,CONCAT48(uVar65,CONCAT44(uVar65,
                                                  uVar65))))))));
      auVar71 = ZEXT3264(CONCAT428(fVar76,CONCAT424(fVar76,CONCAT420(fVar76,CONCAT416(fVar76,
                                                  CONCAT412(fVar76,CONCAT48(fVar76,CONCAT44(fVar76,
                                                  fVar76))))))));
      local_15d8 = context;
      fVar76 = fVar64;
      fVar77 = fVar64;
      fVar78 = fVar64;
      fVar79 = fVar64;
      fVar80 = fVar64;
      fVar81 = fVar64;
      fVar82 = fVar64;
      do {
        uVar32 = local_15e0[-1];
        local_15e0 = local_15e0 + -1;
        while ((uVar32 & 8) == 0) {
          auVar41 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + local_15e8),
                                    auVar85._0_32_);
          auVar41 = vmulps_avx512vl(auVar88._0_32_,auVar41);
          auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + local_15f0),
                                    auVar86._0_32_);
          auVar42 = vmulps_avx512vl(auVar89._0_32_,auVar42);
          auVar41 = vmaxps_avx(auVar41,auVar42);
          auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar30),auVar87._0_32_);
          auVar42 = vmulps_avx512vl(auVar90._0_32_,auVar42);
          auVar42 = vmaxps_avx(auVar42,auVar66._0_32_);
          auVar41 = vmaxps_avx(auVar41,auVar42);
          auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar33),auVar85._0_32_);
          auVar43._4_4_ = fVar76 * auVar42._4_4_;
          auVar43._0_4_ = fVar64 * auVar42._0_4_;
          auVar43._8_4_ = fVar77 * auVar42._8_4_;
          auVar43._12_4_ = fVar78 * auVar42._12_4_;
          auVar43._16_4_ = fVar79 * auVar42._16_4_;
          auVar43._20_4_ = fVar80 * auVar42._20_4_;
          auVar43._24_4_ = fVar81 * auVar42._24_4_;
          auVar43._28_4_ = auVar42._28_4_;
          auVar42 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar34),auVar86._0_32_);
          auVar46._4_4_ = auVar69._4_4_ * auVar42._4_4_;
          auVar46._0_4_ = auVar69._0_4_ * auVar42._0_4_;
          auVar46._8_4_ = auVar69._8_4_ * auVar42._8_4_;
          auVar46._12_4_ = auVar69._12_4_ * auVar42._12_4_;
          auVar46._16_4_ = auVar69._16_4_ * auVar42._16_4_;
          auVar46._20_4_ = auVar69._20_4_ * auVar42._20_4_;
          auVar46._24_4_ = auVar69._24_4_ * auVar42._24_4_;
          auVar46._28_4_ = auVar42._28_4_;
          auVar42 = vminps_avx(auVar43,auVar46);
          auVar43 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar30 ^ 0x20)),
                                    auVar87._0_32_);
          auVar44._4_4_ = auVar75._4_4_ * auVar43._4_4_;
          auVar44._0_4_ = auVar75._0_4_ * auVar43._0_4_;
          auVar44._8_4_ = auVar75._8_4_ * auVar43._8_4_;
          auVar44._12_4_ = auVar75._12_4_ * auVar43._12_4_;
          auVar44._16_4_ = auVar75._16_4_ * auVar43._16_4_;
          auVar44._20_4_ = auVar75._20_4_ * auVar43._20_4_;
          auVar44._24_4_ = auVar75._24_4_ * auVar43._24_4_;
          auVar44._28_4_ = auVar43._28_4_;
          auVar43 = vminps_avx(auVar44,auVar71._0_32_);
          auVar42 = vminps_avx(auVar42,auVar43);
          uVar28 = vcmpps_avx512vl(auVar41,auVar42,2);
          if ((char)uVar28 == '\0') goto LAB_00697986;
          uVar25 = uVar32 & 0xfffffffffffffff0;
          lVar29 = 0;
          for (uVar32 = uVar28; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar32 = *(ulong *)(uVar25 + lVar29 * 8);
          uVar27 = (uint)uVar28 - 1 & (uint)uVar28;
          uVar28 = (ulong)uVar27;
          if (uVar27 != 0) {
            *local_15e0 = uVar32;
            lVar29 = 0;
            for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar27 = uVar27 - 1 & uVar27;
            uVar28 = (ulong)uVar27;
            bVar35 = uVar27 == 0;
            while( true ) {
              local_15e0 = local_15e0 + 1;
              uVar32 = *(ulong *)(uVar25 + lVar29 * 8);
              if (bVar35) break;
              *local_15e0 = uVar32;
              lVar29 = 0;
              for (uVar32 = uVar28; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              uVar28 = uVar28 - 1 & uVar28;
              bVar35 = uVar28 == 0;
            }
          }
        }
        local_15d0 = (ulong)((uint)uVar32 & 0xf) - 8;
        if (local_15d0 != 0) {
          uVar32 = uVar32 & 0xfffffffffffffff0;
          pSVar9 = local_15d8->scene;
          local_15c8 = 0;
          local_14e0 = fVar64;
          fStack_14dc = fVar76;
          fStack_14d8 = fVar77;
          fStack_14d4 = fVar78;
          fStack_14d0 = fVar79;
          fStack_14cc = fVar80;
          fStack_14c8 = fVar81;
          fStack_14c4 = fVar82;
          local_1500 = auVar69._0_32_;
          local_1520 = auVar75._0_32_;
          local_1540 = auVar66._0_32_;
          local_1560 = auVar71._0_32_;
          do {
            lVar26 = local_15c8 * 0x60;
            ppfVar10 = (pSVar9->vertices).items;
            pfVar11 = ppfVar10[*(uint *)(uVar32 + 0x48 + lVar26)];
            auVar47._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar32 + 0x28 + lVar26));
            auVar47._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar32 + 8 + lVar26));
            pfVar12 = ppfVar10[*(uint *)(uVar32 + 0x40 + lVar26)];
            auVar48._16_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar32 + 0x20 + lVar26));
            auVar48._0_16_ = *(undefined1 (*) [16])(pfVar12 + *(uint *)(uVar32 + lVar26));
            pfVar13 = ppfVar10[*(uint *)(uVar32 + 0x4c + lVar26)];
            auVar52._16_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar32 + 0x2c + lVar26));
            auVar52._0_16_ = *(undefined1 (*) [16])(pfVar13 + *(uint *)(uVar32 + 0xc + lVar26));
            pfVar14 = ppfVar10[*(uint *)(uVar32 + 0x44 + lVar26)];
            auVar53._16_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar32 + 0x24 + lVar26));
            auVar53._0_16_ = *(undefined1 (*) [16])(pfVar14 + *(uint *)(uVar32 + 4 + lVar26));
            lVar29 = uVar32 + 0x40 + lVar26;
            local_13e0 = *(undefined8 *)(lVar29 + 0x10);
            uStack_13d8 = *(undefined8 *)(lVar29 + 0x18);
            uStack_13d0 = local_13e0;
            uStack_13c8 = uStack_13d8;
            lVar29 = uVar32 + 0x50 + lVar26;
            local_1400 = *(undefined8 *)(lVar29 + 0x10);
            uStack_13f8 = *(undefined8 *)(lVar29 + 0x18);
            auVar37 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar32 + 0x10 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar32 + 0x18 + lVar26)));
            auVar36 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar32 + 0x10 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar32 + 0x18 + lVar26)));
            auVar39 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar32 + 0x14 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar32 + 0x1c + lVar26)));
            auVar15 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar32 + 0x14 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar32 + 0x1c + lVar26)));
            auVar40 = vunpcklps_avx(auVar36,auVar15);
            auVar38 = vunpcklps_avx(auVar37,auVar39);
            auVar36 = vunpckhps_avx(auVar37,auVar39);
            auVar39 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar32 + 0x30 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar32 + 0x38 + lVar26)));
            auVar15 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar12 + *(uint *)(uVar32 + 0x30 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar11 + *(uint *)(uVar32 + 0x38 + lVar26)));
            auVar67 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar32 + 0x34 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar32 + 0x3c + lVar26)));
            auVar37 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar14 + *(uint *)(uVar32 + 0x34 + lVar26)),
                                    *(undefined1 (*) [16])
                                     (pfVar13 + *(uint *)(uVar32 + 0x3c + lVar26)));
            auVar37 = vunpcklps_avx(auVar15,auVar37);
            auVar16 = vunpcklps_avx(auVar39,auVar67);
            auVar15 = vunpckhps_avx(auVar39,auVar67);
            uStack_13f0 = local_1400;
            uStack_13e8 = uStack_13f8;
            auVar41 = vunpcklps_avx(auVar53,auVar52);
            auVar42 = vunpcklps_avx(auVar48,auVar47);
            auVar46 = vunpcklps_avx(auVar42,auVar41);
            auVar42 = vunpckhps_avx(auVar42,auVar41);
            auVar41 = vunpckhps_avx(auVar53,auVar52);
            auVar43 = vunpckhps_avx(auVar48,auVar47);
            auVar43 = vunpcklps_avx(auVar43,auVar41);
            auVar50._16_16_ = auVar38;
            auVar50._0_16_ = auVar38;
            auVar54._16_16_ = auVar36;
            auVar54._0_16_ = auVar36;
            auVar49._16_16_ = auVar40;
            auVar49._0_16_ = auVar40;
            auVar55._16_16_ = auVar16;
            auVar55._0_16_ = auVar16;
            auVar56._16_16_ = auVar15;
            auVar56._0_16_ = auVar15;
            uVar65 = *(undefined4 *)&(ray->org).field_0;
            auVar57._4_4_ = uVar65;
            auVar57._0_4_ = uVar65;
            auVar57._8_4_ = uVar65;
            auVar57._12_4_ = uVar65;
            auVar57._16_4_ = uVar65;
            auVar57._20_4_ = uVar65;
            auVar57._24_4_ = uVar65;
            auVar57._28_4_ = uVar65;
            auVar44 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
            auVar45 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
            uVar65 = *(undefined4 *)&(ray->dir).field_0;
            auVar70._4_4_ = uVar65;
            auVar70._0_4_ = uVar65;
            auVar70._8_4_ = uVar65;
            auVar70._12_4_ = uVar65;
            auVar70._16_4_ = uVar65;
            auVar70._20_4_ = uVar65;
            auVar70._24_4_ = uVar65;
            auVar70._28_4_ = uVar65;
            auVar51._16_16_ = auVar37;
            auVar51._0_16_ = auVar37;
            uVar65 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
            auVar73._4_4_ = uVar65;
            auVar73._0_4_ = uVar65;
            auVar73._8_4_ = uVar65;
            auVar73._12_4_ = uVar65;
            auVar73._16_4_ = uVar65;
            auVar73._20_4_ = uVar65;
            auVar73._24_4_ = uVar65;
            auVar73._28_4_ = uVar65;
            fVar7 = (ray->dir).field_0.m128[2];
            auVar83._4_4_ = fVar7;
            auVar83._0_4_ = fVar7;
            auVar83._8_4_ = fVar7;
            auVar83._12_4_ = fVar7;
            auVar83._16_4_ = fVar7;
            auVar83._20_4_ = fVar7;
            auVar83._24_4_ = fVar7;
            auVar83._28_4_ = fVar7;
            auVar41 = vsubps_avx(auVar46,auVar57);
            auVar46 = vsubps_avx512vl(auVar42,auVar44);
            auVar43 = vsubps_avx512vl(auVar43,auVar45);
            auVar47 = vsubps_avx512vl(auVar50,auVar57);
            auVar48 = vsubps_avx512vl(auVar54,auVar44);
            auVar49 = vsubps_avx512vl(auVar49,auVar45);
            auVar50 = vsubps_avx512vl(auVar55,auVar57);
            auVar44 = vsubps_avx512vl(auVar56,auVar44);
            auVar45 = vsubps_avx512vl(auVar51,auVar45);
            auVar51 = vsubps_avx512vl(auVar50,auVar41);
            auVar42 = vsubps_avx(auVar44,auVar46);
            auVar52 = vsubps_avx512vl(auVar45,auVar43);
            auVar53 = vsubps_avx512vl(auVar41,auVar47);
            auVar54 = vsubps_avx512vl(auVar46,auVar48);
            auVar55 = vsubps_avx512vl(auVar43,auVar49);
            auVar56 = vsubps_avx512vl(auVar47,auVar50);
            auVar57 = vsubps_avx512vl(auVar48,auVar44);
            auVar58 = vsubps_avx512vl(auVar49,auVar45);
            auVar59 = vaddps_avx512vl(auVar50,auVar41);
            auVar84._0_4_ = auVar44._0_4_ + auVar46._0_4_;
            auVar84._4_4_ = auVar44._4_4_ + auVar46._4_4_;
            auVar84._8_4_ = auVar44._8_4_ + auVar46._8_4_;
            auVar84._12_4_ = auVar44._12_4_ + auVar46._12_4_;
            auVar84._16_4_ = auVar44._16_4_ + auVar46._16_4_;
            auVar84._20_4_ = auVar44._20_4_ + auVar46._20_4_;
            auVar84._24_4_ = auVar44._24_4_ + auVar46._24_4_;
            auVar84._28_4_ = auVar44._28_4_ + auVar46._28_4_;
            auVar60 = vaddps_avx512vl(auVar45,auVar43);
            auVar61 = vmulps_avx512vl(auVar84,auVar52);
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar42,auVar60);
            auVar60 = vmulps_avx512vl(auVar60,auVar51);
            auVar62 = vfmsub231ps_avx512vl(auVar60,auVar52,auVar59);
            auVar60._4_4_ = auVar42._4_4_ * auVar59._4_4_;
            auVar60._0_4_ = auVar42._0_4_ * auVar59._0_4_;
            auVar60._8_4_ = auVar42._8_4_ * auVar59._8_4_;
            auVar60._12_4_ = auVar42._12_4_ * auVar59._12_4_;
            auVar60._16_4_ = auVar42._16_4_ * auVar59._16_4_;
            auVar60._20_4_ = auVar42._20_4_ * auVar59._20_4_;
            auVar60._24_4_ = auVar42._24_4_ * auVar59._24_4_;
            auVar60._28_4_ = auVar59._28_4_;
            auVar36 = vfmsub231ps_fma(auVar60,auVar51,auVar84);
            auVar63._0_4_ = fVar7 * auVar36._0_4_;
            auVar63._4_4_ = fVar7 * auVar36._4_4_;
            auVar63._8_4_ = fVar7 * auVar36._8_4_;
            auVar63._12_4_ = fVar7 * auVar36._12_4_;
            auVar63._16_4_ = fVar7 * 0.0;
            auVar63._20_4_ = fVar7 * 0.0;
            auVar63._24_4_ = fVar7 * 0.0;
            auVar63._28_4_ = 0;
            auVar60 = vfmadd231ps_avx512vl(auVar63,auVar73,auVar62);
            local_13c0 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar61);
            auVar60 = vaddps_avx512vl(auVar41,auVar47);
            auVar59 = vaddps_avx512vl(auVar46,auVar48);
            auVar61 = vaddps_avx512vl(auVar43,auVar49);
            auVar62 = vmulps_avx512vl(auVar59,auVar55);
            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar54,auVar61);
            auVar61 = vmulps_avx512vl(auVar61,auVar53);
            auVar61 = vfmsub231ps_avx512vl(auVar61,auVar55,auVar60);
            auVar60 = vmulps_avx512vl(auVar60,auVar54);
            auVar60 = vfmsub231ps_avx512vl(auVar60,auVar53,auVar59);
            auVar63 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar59._4_4_ = fVar7 * auVar60._4_4_;
            auVar59._0_4_ = fVar7 * auVar60._0_4_;
            auVar59._8_4_ = fVar7 * auVar60._8_4_;
            auVar59._12_4_ = fVar7 * auVar60._12_4_;
            auVar59._16_4_ = fVar7 * auVar60._16_4_;
            auVar59._20_4_ = fVar7 * auVar60._20_4_;
            auVar59._24_4_ = fVar7 * auVar60._24_4_;
            auVar59._28_4_ = auVar60._28_4_;
            auVar60 = vfmadd231ps_avx512vl(auVar59,auVar73,auVar61);
            local_13a0 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar62);
            auVar60 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar59 = vaddps_avx512vl(auVar47,auVar50);
            auVar44 = vaddps_avx512vl(auVar48,auVar44);
            auVar45 = vaddps_avx512vl(auVar49,auVar45);
            auVar47 = vmulps_avx512vl(auVar44,auVar58);
            auVar47 = vfmsub231ps_avx512vl(auVar47,auVar57,auVar45);
            auVar45 = vmulps_avx512vl(auVar45,auVar56);
            auVar45 = vfmsub231ps_avx512vl(auVar45,auVar58,auVar59);
            auVar59 = vmulps_avx512vl(auVar59,auVar57);
            auVar44 = vfmsub231ps_avx512vl(auVar59,auVar56,auVar44);
            auVar44 = vmulps_avx512vl(auVar83,auVar44);
            auVar44 = vfmadd231ps_avx512vl(auVar44,auVar73,auVar45);
            auVar44 = vfmadd231ps_avx512vl(auVar44,auVar70,auVar47);
            auVar61._0_4_ = local_13a0._0_4_ + local_13c0._0_4_;
            auVar61._4_4_ = local_13a0._4_4_ + local_13c0._4_4_;
            auVar61._8_4_ = local_13a0._8_4_ + local_13c0._8_4_;
            auVar61._12_4_ = local_13a0._12_4_ + local_13c0._12_4_;
            auVar61._16_4_ = local_13a0._16_4_ + local_13c0._16_4_;
            auVar61._20_4_ = local_13a0._20_4_ + local_13c0._20_4_;
            auVar61._24_4_ = local_13a0._24_4_ + local_13c0._24_4_;
            auVar61._28_4_ = local_13a0._28_4_ + local_13c0._28_4_;
            local_1380 = vaddps_avx512vl(auVar44,auVar61);
            vandps_avx512vl(local_1380,auVar60);
            auVar45._8_4_ = 0x34000000;
            auVar45._0_8_ = 0x3400000034000000;
            auVar45._12_4_ = 0x34000000;
            auVar45._16_4_ = 0x34000000;
            auVar45._20_4_ = 0x34000000;
            auVar45._24_4_ = 0x34000000;
            auVar45._28_4_ = 0x34000000;
            auVar45 = vmulps_avx512vl(local_1380,auVar45);
            auVar59 = vminps_avx512vl(local_13c0,local_13a0);
            auVar59 = vminps_avx512vl(auVar59,auVar44);
            auVar47 = vxorps_avx512vl(auVar45,auVar63);
            uVar17 = vcmpps_avx512vl(auVar59,auVar47,5);
            auVar59 = vmaxps_avx512vl(local_13c0,local_13a0);
            auVar44 = vmaxps_avx512vl(auVar59,auVar44);
            uVar18 = vcmpps_avx512vl(auVar44,auVar45,2);
            local_1300 = (byte)uVar17 | (byte)uVar18;
            fVar76 = fStack_14dc;
            fVar77 = fStack_14d8;
            fVar78 = fStack_14d4;
            fVar79 = fStack_14d0;
            fVar80 = fStack_14cc;
            fVar81 = fStack_14c8;
            fVar82 = fStack_14c4;
            fVar64 = local_14e0;
            if (local_1300 == 0) {
LAB_0069793e:
              auVar69 = ZEXT3264(local_1500);
              auVar75 = ZEXT3264(local_1520);
              auVar66 = ZEXT3264(local_1540);
              auVar71 = ZEXT3264(local_1560);
            }
            else {
              auVar44 = vmulps_avx512vl(auVar52,auVar54);
              auVar45 = vmulps_avx512vl(auVar51,auVar55);
              auVar59 = vmulps_avx512vl(auVar42,auVar53);
              auVar47 = vmulps_avx512vl(auVar55,auVar57);
              auVar48 = vmulps_avx512vl(auVar53,auVar58);
              auVar49 = vmulps_avx512vl(auVar54,auVar56);
              auVar42 = vfmsub213ps_avx512vl(auVar42,auVar55,auVar44);
              auVar50 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar45);
              auVar51 = vfmsub213ps_avx512vl(auVar51,auVar54,auVar59);
              auVar52 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar47);
              auVar54 = vfmsub213ps_avx512vl(auVar56,auVar55,auVar48);
              auVar53 = vfmsub213ps_avx512vl(auVar57,auVar53,auVar49);
              vandps_avx512vl(auVar44,auVar60);
              vandps_avx512vl(auVar47,auVar60);
              uVar28 = vcmpps_avx512vl(auVar53,auVar53,1);
              vandps_avx512vl(auVar45,auVar60);
              vandps_avx512vl(auVar48,auVar60);
              auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              uVar25 = vcmpps_avx512vl(auVar53,auVar53,1);
              vandps_avx512vl(auVar59,auVar60);
              vandps_avx512vl(auVar49,auVar60);
              uVar19 = vcmpps_avx512vl(auVar44,auVar44,1);
              bVar35 = (bool)((byte)uVar28 & 1);
              local_1360._0_4_ =
                   (float)((uint)bVar35 * auVar42._0_4_ | (uint)!bVar35 * auVar52._0_4_);
              bVar35 = (bool)((byte)(uVar28 >> 1) & 1);
              local_1360._4_4_ =
                   (float)((uint)bVar35 * auVar42._4_4_ | (uint)!bVar35 * auVar52._4_4_);
              bVar35 = (bool)((byte)(uVar28 >> 2) & 1);
              local_1360._8_4_ =
                   (float)((uint)bVar35 * auVar42._8_4_ | (uint)!bVar35 * auVar52._8_4_);
              bVar35 = (bool)((byte)(uVar28 >> 3) & 1);
              local_1360._12_4_ =
                   (float)((uint)bVar35 * auVar42._12_4_ | (uint)!bVar35 * auVar52._12_4_);
              bVar35 = (bool)((byte)(uVar28 >> 4) & 1);
              local_1360._16_4_ =
                   (float)((uint)bVar35 * auVar42._16_4_ | (uint)!bVar35 * auVar52._16_4_);
              bVar35 = (bool)((byte)(uVar28 >> 5) & 1);
              local_1360._20_4_ =
                   (float)((uint)bVar35 * auVar42._20_4_ | (uint)!bVar35 * auVar52._20_4_);
              bVar35 = (bool)((byte)(uVar28 >> 6) & 1);
              local_1360._24_4_ =
                   (float)((uint)bVar35 * auVar42._24_4_ | (uint)!bVar35 * auVar52._24_4_);
              bVar35 = SUB81(uVar28 >> 7,0);
              local_1360._28_4_ = (uint)bVar35 * auVar42._28_4_ | (uint)!bVar35 * auVar52._28_4_;
              bVar35 = (bool)((byte)uVar25 & 1);
              local_1340._0_4_ =
                   (float)((uint)bVar35 * auVar50._0_4_ | (uint)!bVar35 * auVar54._0_4_);
              bVar35 = (bool)((byte)(uVar25 >> 1) & 1);
              local_1340._4_4_ =
                   (float)((uint)bVar35 * auVar50._4_4_ | (uint)!bVar35 * auVar54._4_4_);
              bVar35 = (bool)((byte)(uVar25 >> 2) & 1);
              local_1340._8_4_ =
                   (float)((uint)bVar35 * auVar50._8_4_ | (uint)!bVar35 * auVar54._8_4_);
              bVar35 = (bool)((byte)(uVar25 >> 3) & 1);
              local_1340._12_4_ =
                   (float)((uint)bVar35 * auVar50._12_4_ | (uint)!bVar35 * auVar54._12_4_);
              bVar35 = (bool)((byte)(uVar25 >> 4) & 1);
              local_1340._16_4_ =
                   (float)((uint)bVar35 * auVar50._16_4_ | (uint)!bVar35 * auVar54._16_4_);
              bVar35 = (bool)((byte)(uVar25 >> 5) & 1);
              local_1340._20_4_ =
                   (float)((uint)bVar35 * auVar50._20_4_ | (uint)!bVar35 * auVar54._20_4_);
              bVar35 = (bool)((byte)(uVar25 >> 6) & 1);
              local_1340._24_4_ =
                   (float)((uint)bVar35 * auVar50._24_4_ | (uint)!bVar35 * auVar54._24_4_);
              bVar35 = SUB81(uVar25 >> 7,0);
              local_1340._28_4_ = (uint)bVar35 * auVar50._28_4_ | (uint)!bVar35 * auVar54._28_4_;
              bVar35 = (bool)((byte)uVar19 & 1);
              local_1320._0_4_ =
                   (float)((uint)bVar35 * auVar51._0_4_ | (uint)!bVar35 * auVar53._0_4_);
              bVar35 = (bool)((byte)(uVar19 >> 1) & 1);
              local_1320._4_4_ =
                   (float)((uint)bVar35 * auVar51._4_4_ | (uint)!bVar35 * auVar53._4_4_);
              bVar35 = (bool)((byte)(uVar19 >> 2) & 1);
              local_1320._8_4_ =
                   (float)((uint)bVar35 * auVar51._8_4_ | (uint)!bVar35 * auVar53._8_4_);
              bVar35 = (bool)((byte)(uVar19 >> 3) & 1);
              local_1320._12_4_ =
                   (float)((uint)bVar35 * auVar51._12_4_ | (uint)!bVar35 * auVar53._12_4_);
              bVar35 = (bool)((byte)(uVar19 >> 4) & 1);
              local_1320._16_4_ =
                   (float)((uint)bVar35 * auVar51._16_4_ | (uint)!bVar35 * auVar53._16_4_);
              bVar35 = (bool)((byte)(uVar19 >> 5) & 1);
              local_1320._20_4_ =
                   (float)((uint)bVar35 * auVar51._20_4_ | (uint)!bVar35 * auVar53._20_4_);
              bVar35 = (bool)((byte)(uVar19 >> 6) & 1);
              local_1320._24_4_ =
                   (float)((uint)bVar35 * auVar51._24_4_ | (uint)!bVar35 * auVar53._24_4_);
              bVar35 = SUB81(uVar19 >> 7,0);
              local_1320._28_4_ = (uint)bVar35 * auVar51._28_4_ | (uint)!bVar35 * auVar53._28_4_;
              auVar22._4_4_ = fVar7 * local_1320._4_4_;
              auVar22._0_4_ = fVar7 * local_1320._0_4_;
              auVar22._8_4_ = fVar7 * local_1320._8_4_;
              auVar22._12_4_ = fVar7 * local_1320._12_4_;
              auVar22._16_4_ = fVar7 * local_1320._16_4_;
              auVar22._20_4_ = fVar7 * local_1320._20_4_;
              auVar22._24_4_ = fVar7 * local_1320._24_4_;
              auVar22._28_4_ = fVar7;
              auVar36 = vfmadd213ps_fma(auVar73,local_1340,auVar22);
              auVar36 = vfmadd213ps_fma(auVar70,local_1360,ZEXT1632(auVar36));
              auVar45 = ZEXT1632(CONCAT412(auVar36._12_4_ + auVar36._12_4_,
                                           CONCAT48(auVar36._8_4_ + auVar36._8_4_,
                                                    CONCAT44(auVar36._4_4_ + auVar36._4_4_,
                                                             auVar36._0_4_ + auVar36._0_4_))));
              auVar74._0_4_ = auVar43._0_4_ * local_1320._0_4_;
              auVar74._4_4_ = auVar43._4_4_ * local_1320._4_4_;
              auVar74._8_4_ = auVar43._8_4_ * local_1320._8_4_;
              auVar74._12_4_ = auVar43._12_4_ * local_1320._12_4_;
              auVar74._16_4_ = auVar43._16_4_ * local_1320._16_4_;
              auVar74._20_4_ = auVar43._20_4_ * local_1320._20_4_;
              auVar74._24_4_ = auVar43._24_4_ * local_1320._24_4_;
              auVar74._28_4_ = 0;
              auVar36 = vfmadd213ps_fma(auVar46,local_1340,auVar74);
              auVar15 = vfmadd213ps_fma(auVar41,local_1360,ZEXT1632(auVar36));
              auVar41 = vrcp14ps_avx512vl(auVar45);
              auVar58._8_4_ = 0x3f800000;
              auVar58._0_8_ = 0x3f8000003f800000;
              auVar58._12_4_ = 0x3f800000;
              auVar58._16_4_ = 0x3f800000;
              auVar58._20_4_ = 0x3f800000;
              auVar58._24_4_ = 0x3f800000;
              auVar58._28_4_ = 0x3f800000;
              auVar42 = vfnmadd213ps_avx512vl(auVar41,auVar45,auVar58);
              auVar36 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
              local_12a0 = ZEXT1632(CONCAT412((auVar15._12_4_ + auVar15._12_4_) * auVar36._12_4_,
                                              CONCAT48((auVar15._8_4_ + auVar15._8_4_) *
                                                       auVar36._8_4_,
                                                       CONCAT44((auVar15._4_4_ + auVar15._4_4_) *
                                                                auVar36._4_4_,
                                                                (auVar15._0_4_ + auVar15._0_4_) *
                                                                auVar36._0_4_))));
              uVar65 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar62._4_4_ = uVar65;
              auVar62._0_4_ = uVar65;
              auVar62._8_4_ = uVar65;
              auVar62._12_4_ = uVar65;
              auVar62._16_4_ = uVar65;
              auVar62._20_4_ = uVar65;
              auVar62._24_4_ = uVar65;
              auVar62._28_4_ = uVar65;
              uVar17 = vcmpps_avx512vl(local_12a0,auVar62,0xd);
              auVar41 = vxorps_avx512vl(auVar45,auVar44);
              fVar7 = ray->tfar;
              auVar21._4_4_ = fVar7;
              auVar21._0_4_ = fVar7;
              auVar21._8_4_ = fVar7;
              auVar21._12_4_ = fVar7;
              auVar21._16_4_ = fVar7;
              auVar21._20_4_ = fVar7;
              auVar21._24_4_ = fVar7;
              auVar21._28_4_ = fVar7;
              uVar18 = vcmpps_avx512vl(local_12a0,auVar21,2);
              uVar20 = vcmpps_avx512vl(auVar45,auVar41,4);
              local_1300 = (byte)uVar17 & (byte)uVar18 & (byte)uVar20 & local_1300;
              if (local_1300 == 0) goto LAB_0069793e;
              local_1220 = 0xf0;
              auVar68._8_4_ = 0x219392ef;
              auVar68._0_8_ = 0x219392ef219392ef;
              auVar68._12_4_ = 0x219392ef;
              auVar68._16_4_ = 0x219392ef;
              auVar68._20_4_ = 0x219392ef;
              auVar68._24_4_ = 0x219392ef;
              auVar68._28_4_ = 0x219392ef;
              uVar28 = vcmpps_avx512vl(local_1380,auVar68,5);
              auVar42 = vrcp14ps_avx512vl(local_1380);
              auVar72._8_4_ = 0x3f800000;
              auVar72._0_8_ = 0x3f8000003f800000;
              auVar72._12_4_ = 0x3f800000;
              auVar72._16_4_ = 0x3f800000;
              auVar72._20_4_ = 0x3f800000;
              auVar72._24_4_ = 0x3f800000;
              auVar72._28_4_ = 0x3f800000;
              auVar36 = vfnmadd213ps_fma(local_1380,auVar42,auVar72);
              auVar41 = vfmadd132ps_avx512vl(ZEXT1632(auVar36),auVar42,auVar42);
              fVar1 = (float)((uint)((byte)uVar28 & 1) * auVar41._0_4_);
              fVar2 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar41._4_4_);
              fVar3 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar41._8_4_);
              fVar4 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar41._12_4_);
              fVar5 = (float)((uint)((byte)(uVar28 >> 4) & 1) * auVar41._16_4_);
              fVar6 = (float)((uint)((byte)(uVar28 >> 5) & 1) * auVar41._20_4_);
              fVar7 = (float)((uint)((byte)(uVar28 >> 6) & 1) * auVar41._24_4_);
              auVar23._4_4_ = fVar2 * local_13c0._4_4_;
              auVar23._0_4_ = fVar1 * local_13c0._0_4_;
              auVar23._8_4_ = fVar3 * local_13c0._8_4_;
              auVar23._12_4_ = fVar4 * local_13c0._12_4_;
              auVar23._16_4_ = fVar5 * local_13c0._16_4_;
              auVar23._20_4_ = fVar6 * local_13c0._20_4_;
              auVar23._24_4_ = fVar7 * local_13c0._24_4_;
              auVar23._28_4_ = local_13c0._28_4_;
              auVar41 = vminps_avx(auVar23,auVar72);
              auVar24._4_4_ = local_13a0._4_4_ * fVar2;
              auVar24._0_4_ = local_13a0._0_4_ * fVar1;
              auVar24._8_4_ = local_13a0._8_4_ * fVar3;
              auVar24._12_4_ = local_13a0._12_4_ * fVar4;
              auVar24._16_4_ = local_13a0._16_4_ * fVar5;
              auVar24._20_4_ = local_13a0._20_4_ * fVar6;
              auVar24._24_4_ = local_13a0._24_4_ * fVar7;
              auVar24._28_4_ = auVar42._28_4_;
              auVar42 = vminps_avx(auVar24,auVar72);
              auVar43 = vsubps_avx(auVar72,auVar41);
              auVar46 = vsubps_avx(auVar72,auVar42);
              local_12c0 = vblendps_avx(auVar42,auVar43,0xf0);
              local_12e0 = vblendps_avx(auVar41,auVar46,0xf0);
              local_1280._4_4_ = local_1360._4_4_ * 1.0;
              local_1280._0_4_ = local_1360._0_4_ * 1.0;
              local_1280._8_4_ = local_1360._8_4_ * 1.0;
              local_1280._12_4_ = local_1360._12_4_ * 1.0;
              local_1280._16_4_ = local_1360._16_4_ * -1.0;
              local_1280._20_4_ = local_1360._20_4_ * -1.0;
              local_1280._24_4_ = local_1360._24_4_ * -1.0;
              local_1280._28_4_ = local_1360._28_4_;
              local_1260._4_4_ = local_1340._4_4_ * 1.0;
              local_1260._0_4_ = local_1340._0_4_ * 1.0;
              local_1260._8_4_ = local_1340._8_4_ * 1.0;
              local_1260._12_4_ = local_1340._12_4_ * 1.0;
              local_1260._16_4_ = local_1340._16_4_ * -1.0;
              local_1260._20_4_ = local_1340._20_4_ * -1.0;
              local_1260._24_4_ = local_1340._24_4_ * -1.0;
              local_1260._28_4_ = local_1340._28_4_;
              local_1240._4_4_ = local_1320._4_4_ * 1.0;
              local_1240._0_4_ = local_1320._0_4_ * 1.0;
              local_1240._8_4_ = local_1320._8_4_ * 1.0;
              local_1240._12_4_ = local_1320._12_4_ * 1.0;
              local_1240._16_4_ = local_1320._16_4_ * -1.0;
              local_1240._20_4_ = local_1320._20_4_ * -1.0;
              local_1240._24_4_ = local_1320._24_4_ * -1.0;
              local_1240._28_4_ = local_1320._28_4_;
              local_15f8 = (ulong)local_1300;
              auVar69 = ZEXT3264(local_1500);
              auVar75 = ZEXT3264(local_1520);
              auVar66 = ZEXT3264(local_1540);
              auVar71 = ZEXT3264(local_1560);
              do {
                local_1610 = 0;
                for (uVar28 = local_15f8; (uVar28 & 1) == 0;
                    uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                  local_1610 = local_1610 + 1;
                }
                local_15a8 = *(uint *)((long)&local_13e0 + local_1610 * 4);
                local_1600 = (pSVar9->geometries).items[local_15a8].ptr;
                if ((local_1600->mask & ray->mask) == 0) {
                  local_15f8 = local_15f8 ^ 1L << (local_1610 & 0x3f);
                }
                else {
                  pRVar31 = local_15d8->args;
                  if ((pRVar31->filter == (RTCFilterFunctionN)0x0) &&
                     (local_1600->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00697999:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_14c0 = auVar90._0_32_;
                  local_14a0 = auVar89._0_32_;
                  local_1480 = auVar88._0_32_;
                  local_1460 = auVar87._0_32_;
                  local_1440 = auVar86._0_32_;
                  local_1420 = auVar85._0_32_;
                  uVar28 = (ulong)(uint)((int)local_1610 * 4);
                  local_1590.context = local_15d8->user;
                  local_15c0 = *(undefined4 *)(local_1280 + uVar28);
                  local_15bc = *(undefined4 *)(local_1260 + uVar28);
                  local_15b8 = *(undefined4 *)(local_1240 + uVar28);
                  local_15b4 = *(undefined4 *)(local_12e0 + uVar28);
                  local_15b0 = *(undefined4 *)(local_12c0 + uVar28);
                  local_15ac = *(undefined4 *)((long)&local_1400 + uVar28);
                  local_15a4 = (local_1590.context)->instID[0];
                  local_15a0 = (local_1590.context)->instPrimID[0];
                  fVar76 = ray->tfar;
                  ray->tfar = *(float *)(local_12a0 + uVar28);
                  local_1614 = -1;
                  local_1590.valid = &local_1614;
                  local_1590.geometryUserPtr = local_1600->userPtr;
                  local_1590.hit = (RTCHitN *)&local_15c0;
                  local_1590.N = 1;
                  local_1590.ray = (RTCRayN *)ray;
                  if (((local_1600->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      (local_1608 = pRVar31, (*local_1600->occlusionFilterN)(&local_1590),
                      pRVar31 = local_1608, *local_1590.valid != 0)) &&
                     ((pRVar31->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar31->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_1600->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar31->filter)(&local_1590), *local_1590.valid != 0))))))
                  goto LAB_00697999;
                  ray->tfar = fVar76;
                  local_15f8 = local_15f8 ^ 1L << (local_1610 & 0x3f);
                  auVar85 = ZEXT3264(local_1420);
                  auVar86 = ZEXT3264(local_1440);
                  auVar87 = ZEXT3264(local_1460);
                  auVar88 = ZEXT3264(local_1480);
                  auVar89 = ZEXT3264(local_14a0);
                  auVar90 = ZEXT3264(local_14c0);
                  auVar69 = ZEXT3264(local_1500);
                  auVar75 = ZEXT3264(local_1520);
                  auVar66 = ZEXT3264(local_1540);
                  auVar71 = ZEXT3264(local_1560);
                  fVar64 = local_14e0;
                  fVar76 = fStack_14dc;
                  fVar77 = fStack_14d8;
                  fVar78 = fStack_14d4;
                  fVar79 = fStack_14d0;
                  fVar80 = fStack_14cc;
                  fVar81 = fStack_14c8;
                  fVar82 = fStack_14c4;
                }
              } while (local_15f8 != 0);
            }
            local_15c8 = local_15c8 + 1;
          } while (local_15c8 != local_15d0);
        }
LAB_00697986:
      } while (local_15e0 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }